

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86IMUL(uchar *stream,x86Reg srcdst,int num)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  
  if ((char)(uchar)num == num) {
    bVar1 = (8 < (int)srcdst) * '\x04' | 8 < (int)srcdst;
    bVar4 = bVar1 != 0;
    if (bVar4) {
      *stream = bVar1 | 0x40;
    }
    stream[bVar4] = 'k';
    bVar1 = regCode[srcdst];
    if (7 < bVar1) {
LAB_001d70e9:
      __assert_fail("unsigned(spareField) <= 0x7",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                    ,0x15,"unsigned char encodeRegister(x86Reg, char)");
    }
    puVar3 = stream + bVar4;
    puVar3[1] = bVar1 * '\b' | bVar1 | 0xc0;
    puVar3[2] = (uchar)num;
    iVar2 = (int)puVar3 + 3;
  }
  else {
    bVar1 = (8 < (int)srcdst) * '\x04' | 8 < (int)srcdst;
    bVar4 = bVar1 != 0;
    if (bVar4) {
      *stream = bVar1 | 0x40;
    }
    stream[bVar4] = 'i';
    bVar1 = regCode[srcdst];
    if (7 < bVar1) goto LAB_001d70e9;
    puVar3 = stream + bVar4;
    puVar3[1] = bVar1 * '\b' | bVar1 | 0xc0;
    *(int *)(puVar3 + 2) = num;
    iVar2 = (int)puVar3 + 6;
  }
  return iVar2 - (int)stream;
}

Assistant:

int x86IMUL(unsigned char *stream, x86Reg srcdst, int num)
{
	unsigned char *start = stream;

	if((char)(num) == num)
	{
		stream += encodeRex(stream, false, srcdst, rNONE, srcdst);
		*stream++ = 0x6b;
		*stream++ = encodeRegister(srcdst, regCode[srcdst]);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	stream += encodeRex(stream, false, srcdst, rNONE, srcdst);
	*stream++ = 0x69;
	*stream++ = encodeRegister(srcdst, regCode[srcdst]);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}